

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_json.cpp
# Opt level: O3

shared_ptr<cppcms::rpc::json_call> __thiscall
cppcms::rpc::json_rpc_server::release_call(json_rpc_server *this)

{
  shared_ptr<cppcms::rpc::json_call> *psVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  json_rpc_server *in_RSI;
  _data *this_00;
  shared_ptr<cppcms::rpc::json_call> sVar4;
  element_type *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  check_call(in_RSI);
  peVar2 = (in_RSI->current_call_).
           super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  application::release_context((application *)&local_30);
  (peVar2->context_).super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_30;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(peVar2->context_).
              super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_28);
  _Var3._M_pi = extraout_RDX;
  if ((_data *)local_28._M_pi != (_data *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
    _Var3._M_pi = extraout_RDX_00;
  }
  psVar1 = &in_RSI->current_call_;
  (this->super_application)._vptr_application =
       (_func_int **)
       (in_RSI->current_call_).
       super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (_data *)(in_RSI->current_call_).
                     super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
  (this->super_application).d.ptr_ = this_00;
  if (this_00 == (_data *)0x0) {
    (psVar1->super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)0x0;
    (in_RSI->current_call_).super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(this_00->conn).super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr =
           *(int *)&(this_00->conn).
                    super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1
      ;
      UNLOCK();
      this_00 = (_data *)(in_RSI->current_call_).
                         super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
      (psVar1->super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)0x0;
      (in_RSI->current_call_).super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (this_00 == (_data *)0x0) goto LAB_002154ad;
    }
    else {
      *(int *)&(this_00->conn).super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr =
           *(int *)&(this_00->conn).
                    super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1
      ;
      (psVar1->super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)0x0;
      (in_RSI->current_call_).super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    _Var3._M_pi = extraout_RDX_01;
  }
LAB_002154ad:
  sVar4.super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cppcms::rpc::json_call>)
         sVar4.super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

booster::shared_ptr<json_call> json_rpc_server::release_call()
	{
		check_call();
		current_call_->attach_context(release_context());
		booster::shared_ptr<json_call> call = current_call_;
		current_call_.reset();
		return call;
	}